

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

void __thiscall GLFWGraphicsContext::GLFWGraphicsContext(GLFWGraphicsContext *this)

{
  int iVar1;
  GLFWwindow *handle;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  runtime_error *this_00;
  
  (this->super_GraphicsContext)._vptr_GraphicsContext =
       (_func_int **)&PTR__GLFWGraphicsContext_001d3818;
  this->_window = (GLFWwindow *)0x0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    setGlfwFlags();
    glfwWindowHint(0x20004,0);
    handle = glfwCreateWindow(0x10,0x10,"Root graphics context",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                             );
    glfwMakeContextCurrent(handle);
    glfwSwapInterval(1);
    glewExperimental = '\x01';
    glewInit();
    if (__GLEW_VERSION_4_1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cerr,"glew didn\'t init properly");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (__glewProgramParameteri == (PFNGLPROGRAMPARAMETERIPROC)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"glew didn\'t init properly");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pcVar3 = (char *)glGetString(0x1f01);
    pcVar4 = (char *)glGetString(0x1f02);
    poVar2 = std::operator<<((ostream *)&std::cout,"OpenGL Renderer: ");
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"OpenGL Version: ");
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    this->_window = handle;
    glfwMakeContextCurrent((GLFWwindow *)0x0);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not initialize glfw");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GLFWGraphicsContext()
    {
        glfwSetErrorCallback(error_callback);
        if (!glfwInit())
            throw std::runtime_error("Could not initialize glfw");

        setGlfwFlags();
        glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

        GLFWwindow* window = glfwCreateWindow(16, 16, "Root graphics context", NULL, NULL);
        glfwMakeContextCurrent(window);
        glfwSwapInterval(1); // must be set when a window's context is current

        glewExperimental = GL_TRUE;
        glewInit(); // create GLEW after the context has been created

        if (!GLEW_VERSION_4_1)
            std::cerr << "glew didn't init properly" << std::endl;

        if (!glProgramParameteri)
            std::cerr << "glew didn't init properly" << std::endl;

        // get version info
        const GLubyte* renderer = glGetString(GL_RENDERER); // get renderer string
        const GLubyte* version = glGetString(GL_VERSION); // version as a string
        std::cout << "OpenGL Renderer: " << renderer << std::endl;
        std::cout << "OpenGL Version: " << version << std::endl;

        _window = window;

        // the context should only be captured when it's in use, as it can't be
        // captured in two places at once
        glfwMakeContextCurrent(nullptr);
    }